

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall sptk::reaper::EpochTracker::GetVoiceTransitionFeatures(EpochTracker *this)

{
  float fVar1;
  int iVar2;
  reference pvVar3;
  long in_RDI;
  int32_t bframe;
  int32_t frame_1;
  float prob_offset;
  float prob_onset;
  float delta_rms;
  int32_t frame;
  int32_t limit;
  int32_t frame_offset;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_c;
  
  local_c = RoundUp((*(float *)(in_RDI + 0x1a8) * 0.5) / *(float *)(in_RDI + 0x174));
  if (local_c < 1) {
    local_c = 1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar4 = *(int *)(in_RDI + 0x134);
  for (local_14 = local_c; local_14 < iVar4 - local_c; local_14 = local_14 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x98),
                        (long)(local_14 + local_c));
    fVar1 = *pvVar3;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x98),
                        (long)(local_14 - local_c));
    local_18 = (fVar1 - *pvVar3) / *(float *)(in_RDI + 0x1ac);
    if (local_18 <= 1.0) {
      if (local_18 < -1.0) {
        local_18 = -1.0;
      }
    }
    else {
      local_18 = 1.0;
    }
    fVar1 = -local_18;
    if (local_18 <= 1.0) {
      if (local_18 < 0.0) {
        local_18 = 0.0;
      }
    }
    else {
      local_18 = 1.0;
    }
    if (fVar1 <= 1.0) {
      if (fVar1 < 0.0) {
        fVar1 = 0.0;
      }
    }
    else {
      fVar1 = 1.0;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),(long)local_14);
    *pvVar3 = local_18;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 200),(long)local_14);
    *pvVar3 = fVar1;
  }
  for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
    iVar2 = (*(int *)(in_RDI + 0x134) + -1) - iVar4;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 200),(long)iVar4);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),(long)iVar4);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 200),(long)iVar2);
    *pvVar3 = 0.0;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0xb0),(long)iVar2);
    *pvVar3 = 0.0;
  }
  return;
}

Assistant:

void EpochTracker::GetVoiceTransitionFeatures(void) {
  int32_t frame_offset = RoundUp(0.5 * time_span_ / internal_frame_interval_);
  if (frame_offset <= 0) {
    frame_offset = 1;
  }
  voice_onset_prob_.resize(n_feature_frames_);
  voice_offset_prob_.resize(n_feature_frames_);
  int32_t limit = n_feature_frames_ - frame_offset;
  for (int32_t frame = frame_offset; frame < limit; ++frame) {
    float delta_rms = (bandpassed_rms_[frame + frame_offset] -
                       bandpassed_rms_[frame - frame_offset]) / level_change_den_;
    if (delta_rms > 1.0) {
      delta_rms = 1.0;
    } else {
      if (delta_rms < -1.0) {
        delta_rms = -1.0;
      }
    }
    float prob_onset = delta_rms;
    float prob_offset = -prob_onset;
    if (prob_onset > 1.0) {
      prob_onset = 1.0;
    } else {
      if (prob_onset < 0.0) {
        prob_onset = 0.0;
      }
    }
    if (prob_offset > 1.0) {
      prob_offset = 1.0;
    } else {
      if (prob_offset < 0.0) {
        prob_offset = 0.0;
      }
    }
    voice_onset_prob_[frame] = prob_onset;
    voice_offset_prob_[frame] = prob_offset;
  }
  // Just set the onset and offset probs to zero in the end zones.
  for (int32_t frame = 0; frame < frame_offset; ++frame) {
    int32_t bframe = n_feature_frames_ - 1 - frame;
    voice_onset_prob_[frame] = voice_offset_prob_[frame] = 0.0;
    voice_onset_prob_[bframe] = voice_offset_prob_[bframe] = 0.0;
  }
}